

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.hpp
# Opt level: O0

void __thiscall
ylt::metric::basic_dynamic_counter<double,(unsigned_char)2>::
serialize_map<std::vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,(unsigned_char)2>::metric_pair>,std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,(unsigned_char)2>::metric_pair>>>>
          (basic_dynamic_counter<double,_(unsigned_char)__x02_> *this,
          vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_>_>
          *value_map,string *str)

{
  bool bVar1;
  element_type *peVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  double val;
  key_type *labels_value;
  shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>
  *e;
  iterator __end0;
  iterator __begin0;
  vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_>_>
  *__range3;
  vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_>_>
  *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  *in_stack_ffffffffffffff88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff90;
  _Alloc_hider in_stack_ffffffffffffff98;
  basic_dynamic_counter<double,_(unsigned_char)__x02_> *in_stack_ffffffffffffffa0;
  __normal_iterator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_*,_std::vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_>_>_>
  local_28 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  local_18 = in_RDX;
  local_28[0]._M_current =
       (shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>
        *)std::
          vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::metric_pair>_>_>
          ::begin(in_stack_ffffffffffffff68);
  std::
  vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::metric_pair>_>_>
  ::end(in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_*,_std::vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_>_>_>
                      ((__normal_iterator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_*,_std::vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_>_>_>
                        *)in_stack_ffffffffffffff70,
                       (__normal_iterator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_*,_std::vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_>_>_>
                        *)in_stack_ffffffffffffff68);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::metric_pair>_*,_std::vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::metric_pair>_>_>_>
    ::operator*(local_28);
    std::
    __shared_ptr_access<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::metric_pair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x266d0a);
    peVar2 = std::
             __shared_ptr_access<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::metric_pair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x266d19);
    std::__atomic_float<double>::load(&(peVar2->value).super___atomic_float<double>,relaxed);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_RDI,in_stack_ffffffffffffff78);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_RDI);
    if (bVar1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (in_RDI,(char *)in_stack_ffffffffffffff78);
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (in_RDI,(char *)in_stack_ffffffffffffff78);
      build_string<std::array<std::__cxx11::string,2ul>>
                (in_stack_ffffffffffffffa0,(string *)in_stack_ffffffffffffff98._M_p,
                 in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (in_RDI,(char *)in_stack_ffffffffffffff78);
    }
    in_stack_ffffffffffffff78 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &stack0xffffffffffffff98;
    in_stack_ffffffffffffff70 = local_18;
    std::__cxx11::to_string((double)in_stack_ffffffffffffff78);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_RDI,in_stack_ffffffffffffff78);
    std::__cxx11::string::~string(in_stack_ffffffffffffff70);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_RDI,(char *)in_stack_ffffffffffffff78);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::metric_pair>_*,_std::vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::metric_pair>_>_>_>
    ::operator++(local_28);
  }
  return;
}

Assistant:

void serialize_map(T &value_map, std::string &str) {
    for (auto &e : value_map) {
      auto &labels_value = e->label;
      auto val = e->value.load(std::memory_order::relaxed);
      str.append(Base::name_);
      if (Base::labels_name_.empty()) {
        str.append(" ");
      }
      else {
        str.append("{");
        build_string(str, Base::labels_name_, labels_value);
        str.append("} ");
      }

      str.append(std::to_string(val));

      str.append("\n");
    }
  }